

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int get_adjacent_loc(char *prompt,char *emsg,xchar x,xchar y,coord *cc,schar *dz)

{
  int iVar1;
  undefined8 in_RAX;
  schar dy;
  schar dx;
  undefined2 local_22;
  
  local_22 = (undefined2)((ulong)in_RAX >> 0x38);
  iVar1 = getdir(prompt,(schar *)((long)&local_22 + 1),(schar *)&local_22,dz);
  if (iVar1 == 0) {
    emsg = "Never mind.";
  }
  else {
    if (((byte)(y + (char)local_22) < 0x15 && cc != (coord *)0x0) &&
        (byte)((x + local_22._1_1_) - 1U) < 0x4f) {
      cc->x = x + local_22._1_1_;
      cc->y = y + (char)local_22;
      return 1;
    }
    if (emsg == (char *)0x0) {
      return 0;
    }
  }
  pline(emsg);
  return 0;
}

Assistant:

int get_adjacent_loc(const char *prompt, const char *emsg, xchar x, xchar y,
		     coord *cc, schar *dz)
{
	xchar new_x, new_y;
	schar dx, dy;
	
	if (!getdir(prompt, &dx, &dy, dz)) {
		pline("Never mind.");
		return 0;
	}
	new_x = x + dx;
	new_y = y + dy;
	if (cc && isok(new_x, new_y)) {
		cc->x = new_x;
		cc->y = new_y;
	} else {
		if (emsg)
		    pline(emsg);
		return 0;
	}
	return 1;
}